

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O2

ggml_backend_dev_t ggml_backend_dev_get(size_t index)

{
  bool bVar1;
  size_t sVar2;
  ggml_backend_dev_t pgVar3;
  char *a;
  char *b;
  ulong index_00;
  
  sVar2 = ggml_backend_dev_count();
  if (index < sVar2) {
    get_reg();
    return get_reg::reg.devices.
           super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl
           .super__Vector_impl_data._M_start[index];
  }
  b = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend-reg.cpp";
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend-reg.cpp"
             ,0x15c,"GGML_ASSERT(%s) failed","index < ggml_backend_dev_count()");
  index_00 = 0;
  do {
    sVar2 = ggml_backend_dev_count();
    if (sVar2 <= index_00) {
      return (ggml_backend_dev_t)0x0;
    }
    pgVar3 = ggml_backend_dev_get(index_00);
    a = (char *)ggml_backend_dev_name(pgVar3);
    bVar1 = striequals(a,b);
    index_00 = index_00 + 1;
  } while (!bVar1);
  return pgVar3;
}

Assistant:

ggml_backend_dev_t ggml_backend_dev_get(size_t index) {
    GGML_ASSERT(index < ggml_backend_dev_count());
    return get_reg().devices[index];
}